

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  ImGuiTable *pIVar1;
  ImVector<ImGuiTable> *this_00;
  int *in_RDI;
  ImGuiTable *unaff_retaddr;
  int idx;
  undefined8 in_stack_ffffffffffffffc8;
  int iVar2;
  ImVector<ImGuiTable> *in_stack_ffffffffffffffd0;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_RDI[8] == *in_RDI) {
    ImVector<ImGuiTable>::resize(in_stack_ffffffffffffffd0,iVar2);
    in_RDI[8] = in_RDI[8] + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiTable>::operator[](in_stack_ffffffffffffffd0,iVar2);
    in_RDI[8] = pIVar1->ID;
  }
  pIVar1 = ImVector<ImGuiTable>::operator[](in_stack_ffffffffffffffd0,iVar2);
  iVar2 = (int)((ulong)pIVar1 >> 0x20);
  this_00 = (ImVector<ImGuiTable> *)operator_new(0x1e0);
  ImGuiTable::ImGuiTable(unaff_retaddr);
  pIVar1 = ImVector<ImGuiTable>::operator[](this_00,iVar2);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }